

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_jpege_vepu2_v2.c
# Opt level: O0

MPP_RET hal_jpege_vepu2_set_extra_info(MppDev dev,JpegeSyntax *syntax,RK_U32 start_mbrow)

{
  undefined1 local_50 [8];
  VepuOffsetCfg cfg;
  RK_U32 start_mbrow_local;
  JpegeSyntax *syntax_local;
  MppDev dev_local;
  
  local_50._0_4_ = syntax->format;
  local_50._4_4_ = syntax->width;
  cfg.fmt = syntax->height;
  cfg.width = syntax->hor_stride;
  cfg.height = syntax->ver_stride;
  cfg.hor_stride = syntax->offset_x;
  cfg.ver_stride = syntax->offset_y + start_mbrow * 0x10;
  cfg.offset_pixel[1] = start_mbrow;
  unique0x100000a7 = syntax;
  get_vepu_offset_cfg((VepuOffsetCfg *)local_50);
  if (cfg.offset_x != 0) {
    mpp_dev_set_reg_offset(dev,0x30,cfg.offset_x);
  }
  if (cfg.offset_y != 0) {
    mpp_dev_set_reg_offset(dev,0x31,cfg.offset_y);
  }
  if (cfg.offset_byte[0] != 0) {
    mpp_dev_set_reg_offset(dev,0x32,cfg.offset_byte[0]);
  }
  return MPP_OK;
}

Assistant:

static MPP_RET hal_jpege_vepu2_set_extra_info(MppDev dev, JpegeSyntax *syntax,
                                              RK_U32 start_mbrow)
{
    VepuOffsetCfg cfg;

    cfg.fmt = syntax->format;
    cfg.width = syntax->width;
    cfg.height = syntax->height;
    cfg.hor_stride = syntax->hor_stride;
    cfg.ver_stride = syntax->ver_stride;
    cfg.offset_x = syntax->offset_x;
    cfg.offset_y = syntax->offset_y + start_mbrow * 16;

    get_vepu_offset_cfg(&cfg);

    if (cfg.offset_byte[0])
        mpp_dev_set_reg_offset(dev, VEPU2_REG_INPUT_Y, cfg.offset_byte[0]);

    if (cfg.offset_byte[1])
        mpp_dev_set_reg_offset(dev, VEPU2_REG_INPUT_U, cfg.offset_byte[1]);

    if (cfg.offset_byte[2])
        mpp_dev_set_reg_offset(dev, VEPU2_REG_INPUT_V, cfg.offset_byte[2]);

    return MPP_OK;
}